

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderSearch.h
# Opt level: O1

string * __thiscall
HeaderSearch::operator()[abi_cxx11_(string *__return_storage_ptr__,HeaderSearch *this,Token *token)

{
  bool *url;
  string *str;
  pointer pcVar1;
  size_type sVar2;
  Page *pPVar3;
  string_view subtoken;
  undefined1 local_e8 [8];
  string transformedHtmlPage;
  long local_b8;
  undefined1 local_a8 [8];
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> link;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70;
  string local_50;
  
  if (token->type == header) {
    url = &link.
           super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
           _M_payload.
           super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
           _M_engaged;
    link.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _16_8_ = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)url,"/w/cpp/header","");
    pPVar3 = SearchBase::getPage(&this->super_SearchBase,(string *)url);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)link.
           super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
           _M_payload.
           super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
           _16_8_ != &local_80) {
      operator_delete((void *)link.
                              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                              ._16_8_,local_80._M_allocated_capacity + 1);
    }
    pcVar1 = (pPVar3->content)._M_dataplus._M_p;
    str = (string *)((long)&transformedHtmlPage.field_2 + 8);
    transformedHtmlPage.field_2._8_8_ = &stack0xffffffffffffff48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)str,pcVar1,pcVar1 + (pPVar3->content)._M_string_length);
    replaceHtmlSymbols((string *)local_e8,str);
    if ((long *)transformedHtmlPage.field_2._8_8_ != &stack0xffffffffffffff48) {
      operator_delete((void *)transformedHtmlPage.field_2._8_8_,local_b8 + 1);
    }
    pcVar1 = (token->content)._M_dataplus._M_p;
    sVar2 = (token->content)._M_string_length;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"<tt>","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"</tt>","");
    subtoken._M_str = pcVar1;
    subtoken._M_len = sVar2;
    SearchBase::findLinkToSubtoken
              ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_a8,
               &this->super_SearchBase,(string *)local_e8,subtoken,&local_50,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (link.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_payload._8_1_ == '\0') {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,
                 link.
                 super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                 ._M_payload._M_value._M_len,
                 (long)local_a8 +
                 link.
                 super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                 ._M_payload._M_value._M_len);
    }
    if (local_e8 != (undefined1  [8])&transformedHtmlPage._M_string_length) {
      operator_delete((void *)local_e8,transformedHtmlPage._M_string_length + 1);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(const Token& token) {
			if (token.type != Token::Type::header) {
				return "";
			}


			Page* page = getPage("/w/cpp/header");
			const std::string transformedHtmlPage = replaceHtmlSymbols(page->content);
			const std::optional<std::string_view> link = findLinkToSubtoken(transformedHtmlPage, token.content, "<tt>", "</tt>");
			if (!link.has_value()) {
				return "";
			}

			return std::string(link.value());
		}